

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O3

void __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
ConsiderMarkingResultVar<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::TanId>>
          (Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::TanId>
                 *con,int i,ExpressionAcceptanceLevel eal)

{
  int res_var;
  bool bVar1;
  
  res_var = (con->super_FunctionalConstraint).result_var_;
  if (-1 < res_var) {
    bVar1 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ::IfVarBoundsStrongerThanInitExpr
                      ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                        *)(this + -0x208),res_var);
    if (!bVar1) {
      AutoExpand<std::vector<bool,std::allocator<bool>>>
                ((vector<bool,_std::allocator<bool>_> *)(this + -0x150),
                 (long)(con->super_FunctionalConstraint).result_var_,false);
      return;
    }
  }
  return;
}

Assistant:

void ConsiderMarkingResultVar(
      const Con& con, int i, ExpressionAcceptanceLevel eal) {
    assert(ExpressionAcceptanceLevel::NotAccepted!=eal);
    if (con.HasResultVar()) {         // A functional constraint
      assert(                     // Check: the result var has \a con as the init expr
          MPD( template GetInitExpressionOfType<Con>(con.GetResultVar()) )
          == &con);
      if (con.IsLogical()         // Fixed logical results handled differently
          || !MPD( IfVarBoundsStrongerThanInitExpr(con.GetResultVar()) ) )
        MPD( MarkAsExpression(con.GetResultVar()) );   // can be changed later
    }
  }